

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execAddRgEa<(moira::Instr)4,(moira::Mode)3,(moira::Size)1>(Moira *this,u16 opcode)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  u32 uVar4;
  undefined8 in_RAX;
  u32 val;
  u32 data;
  u32 ea;
  undefined8 local_18;
  
  local_18 = in_RAX;
  bVar3 = readOp<(moira::Mode)3,(moira::Size)1,0ul>
                    (this,opcode & 7,(u32 *)((long)&local_18 + 4),(u32 *)&local_18);
  if (bVar3) {
    uVar1 = *(uint *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58);
    val = (uVar1 & 0xff) + (u32)local_18;
    bVar3 = (bool)((byte)(val >> 8) & 1);
    (this->reg).sr.c = bVar3;
    (this->reg).sr.x = bVar3;
    bVar2 = (byte)val;
    (this->reg).sr.v = (bool)((byte)(((byte)local_18 ^ bVar2) & ((byte)uVar1 ^ bVar2)) >> 7);
    (this->reg).sr.z = bVar2 == 0;
    (this->reg).sr.n = (bool)(bVar2 >> 7);
    uVar4 = (this->reg).pc;
    (this->reg).pc0 = uVar4;
    (this->queue).ird = (this->queue).irc;
    uVar4 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar4 + 2);
    (this->queue).irc = (u16)uVar4;
    writeM<(moira::MemSpace)1,(moira::Size)1,4ul>(this,local_18._4_4_,val);
  }
  return;
}

Assistant:

void
Moira::execAddRgEa(u16 opcode)
{
    u32 ea, data, result;

    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;
    result = addsub<I,S>(readD<S>(src), data);

    prefetch();
    writeM <M, S, POLLIPL> (ea, result);
}